

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O1

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::error
          (BuildSystemFrontendDelegate *this,StringRef filename,Token *at,Twine *message)

{
  void *pvVar1;
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> _Var2;
  FileSystem *pFVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char **ppcVar7;
  SMLoc Loc;
  ArrayRef<llvm::SMRange> Ranges;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> buffer;
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> local_90;
  char *local_88;
  char *pcStack_80;
  SrcBuffer local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pcVar6 = filename.Data;
  pvVar1 = this->impl;
  LOCK();
  *(int *)((long)pvVar1 + 0x18) = *(int *)((long)pvVar1 + 0x18) + 1;
  UNLOCK();
  Loc.Ptr = (char *)0x0;
  local_88 = (char *)0x0;
  pcStack_80 = (char *)0x0;
  if ((filename.Length == 0) || (at->start == (char *)0x0)) goto LAB_001aa5a5;
  pFVar3 = BuildSystem::getFileSystem(*(BuildSystem **)(*(long *)((long)pvVar1 + 0x30) + 0x20));
  local_78.Buffer._M_t.
  super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
  super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
  super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl =
       (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
       &local_78.IncludeLoc;
  if (pcVar6 == (char *)0x0) {
    local_78.OffsetCache.Val.Val.Value = (ValTy)(ValTy)0x0;
    local_78.IncludeLoc.Ptr = local_78.IncludeLoc.Ptr & 0xffffffffffffff00;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,pcVar6,pcVar6 + filename.Length);
  }
  (*pFVar3->_vptr_FileSystem[4])(&local_90,pFVar3,&local_78);
  if (local_78.Buffer._M_t.
      super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
      super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
      super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl !=
      (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
      &local_78.IncludeLoc) {
    operator_delete((void *)local_78.Buffer._M_t.
                            super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>
                            .super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl,
                    (ulong)(local_78.IncludeLoc.Ptr + 1));
  }
  _Var2._M_head_impl = local_90._M_head_impl;
  if (local_90._M_head_impl == (MemoryBuffer *)0x0) {
LAB_001aa588:
    Loc.Ptr = (char *)0x0;
  }
  else {
    uVar5 = (long)at->start - *(long *)((long)pvVar1 + 8);
    uVar4 = (ulong)(at->length + (int)uVar5);
    pcVar6 = (local_90._M_head_impl)->BufferStart;
    if ((ulong)((long)(local_90._M_head_impl)->BufferEnd - (long)pcVar6) <= uVar4)
    goto LAB_001aa588;
    Loc.Ptr = pcVar6 + (uVar5 & 0xffffffff);
    pcStack_80 = pcVar6 + uVar4;
    local_90._M_head_impl = (MemoryBuffer *)0x0;
    local_78.OffsetCache.Val.Val.Value = (ValTy)(ValTy)0x0;
    local_78.IncludeLoc.Ptr = (char *)0x0;
    local_78.Buffer._M_t.
    super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
    super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
    super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl =
         (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         _Var2._M_head_impl;
    local_88 = Loc.Ptr;
    std::vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>::
    emplace_back<llvm::SourceMgr::SrcBuffer>(*this->impl,&local_78);
    llvm::SourceMgr::SrcBuffer::~SrcBuffer(&local_78);
  }
  if (local_90._M_head_impl != (MemoryBuffer *)0x0) {
    (*(local_90._M_head_impl)->_vptr_MemoryBuffer[1])();
  }
LAB_001aa5a5:
  if (local_88 == (char *)0x0) {
    local_58 = 0;
    uStack_50 = 0;
    ppcVar7 = (char **)0x0;
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    ppcVar7 = &local_88;
  }
  Ranges.Length._0_1_ = local_88 != (char *)0x0;
  Ranges.Data = (SMRange *)ppcVar7;
  Ranges.Length._1_7_ = 0;
  llvm::SourceMgr::PrintMessage
            (*this->impl,Loc,DK_Error,message,Ranges,(ArrayRef<llvm::SMFixIt>)ZEXT816(0),true);
  fflush(_stderr);
  return;
}

Assistant:

void
BuildSystemFrontendDelegate::error(StringRef filename,
                                   const Token& at,
                                   const Twine& message) {
  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
  
  ++impl->numErrors;

  // If we have a file and token, resolve the location and range to one
  // accessible by the source manager.
  //
  // FIXME: We shouldn't need to do this, but should switch llbuild to using
  // SourceMgr natively.
  llvm::SMLoc loc{};
  llvm::SMRange range{};
  if (!filename.empty() && at.start) {
    // FIXME: We ignore errors here, for now, this will be resolved when we move
    // to SourceMgr completely.
    auto buffer = impl->frontend->system->getFileSystem().getFileContents(filename);
    if (buffer) {
      unsigned offset = at.start - impl->bufferBeingParsed.data();
      if (offset + at.length < buffer->getBufferSize()) {
        range.Start = loc = llvm::SMLoc::getFromPointer(
            buffer->getBufferStart() + offset);
        range.End = llvm::SMLoc::getFromPointer(
            buffer->getBufferStart() + (offset + at.length));
        getSourceMgr().AddNewSourceBuffer(std::move(buffer), llvm::SMLoc{});
      }
    }
  }

  if (range.Start.isValid()) {
    getSourceMgr().PrintMessage(loc, llvm::SourceMgr::DK_Error, message, range);
  } else {
    getSourceMgr().PrintMessage(loc, llvm::SourceMgr::DK_Error, message);
  }
  fflush(stderr);
}